

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O0

void __thiscall Nova::Example<float,_1>::Register_Options(Example<float,_1> *this)

{
  Parse_Args *pPVar1;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  Example<float,_1> *local_10;
  Example<float,_1> *this_local;
  
  if (this->parse_args != (Parse_Args *)0x0) {
    pPVar1 = this->parse_args;
    local_10 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"-o",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"output directory",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"",&local_b9);
    Parse_Args::Add_String_Argument
              (pPVar1,(string *)local_30,(string *)local_68,(string *)local_90,(string *)local_b8);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    pPVar1 = this->parse_args;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"-restart",&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"frame",&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"restart frame",&local_131);
    Parse_Args::Add_Integer_Argument
              (pPVar1,(string *)local_e0,0,(string *)local_108,(string *)local_130);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    pPVar1 = this->parse_args;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"-test_number",&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"test",&local_181);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"test number",&local_1a9);
    Parse_Args::Add_Integer_Argument
              (pPVar1,(string *)local_158,1,(string *)local_180,(string *)local_1a8);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    pPVar1 = this->parse_args;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"-substeps",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"level",&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"substep output level",&local_221);
    Parse_Args::Add_Integer_Argument
              (pPVar1,(string *)local_1d0,-1,(string *)local_1f8,(string *)local_220);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    pPVar1 = this->parse_args;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"-first_frame",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"frame",&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"first frame",&local_299);
    Parse_Args::Add_Integer_Argument
              (pPVar1,(string *)local_248,0,(string *)local_270,(string *)local_298);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    pPVar1 = this->parse_args;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"-last_frame",&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e8,"frame",&local_2e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_310,"last frame",&local_311);
    Parse_Args::Add_Integer_Argument
              (pPVar1,(string *)local_2c0,0,(string *)local_2e8,(string *)local_310);
    std::__cxx11::string::~string(local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    pPVar1 = this->parse_args;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_338,"-framerate",&local_339);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"frame rate",&local_361);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_388,"",&local_389);
    Parse_Args::Add_Double_Argument
              (pPVar1,(string *)local_338,24.0,(string *)local_360,(string *)local_388);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator((allocator<char> *)&local_339);
  }
  return;
}

Assistant:

void Example<T,d>::
Register_Options()
{
    if(!parse_args) return;
    parse_args->Add_String_Argument("-o","","output directory");
    parse_args->Add_Integer_Argument("-restart",0,"frame","restart frame");
    parse_args->Add_Integer_Argument("-test_number",1,"test","test number");
    parse_args->Add_Integer_Argument("-substeps",-1,"level","substep output level");
    parse_args->Add_Integer_Argument("-first_frame",0,"frame","first frame");
    parse_args->Add_Integer_Argument("-last_frame",0,"frame","last frame");
    parse_args->Add_Double_Argument("-framerate",24,"frame rate");
}